

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv__unknown_err_code(int err)

{
  char *local_48;
  char *copy;
  char buf [32];
  int err_local;
  
  snprintf((char *)&copy,0x20,"Unknown system error %d",(ulong)(uint)err);
  local_48 = uv__strdup((char *)&copy);
  if (local_48 == (char *)0x0) {
    local_48 = "Unknown system error";
  }
  return local_48;
}

Assistant:

static const char* uv__unknown_err_code(int err) {
  char buf[32];
  char* copy;

  snprintf(buf, sizeof(buf), "Unknown system error %d", err);
  copy = uv__strdup(buf);

  return copy != NULL ? copy : "Unknown system error";
}